

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_opc_mxu__pool18(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  generate_exception_err((DisasContext_conflict4 *)env,0x14,0);
  return;
}

Assistant:

static void decode_opc_mxu__pool18(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 18, 3);

    switch (opcode) {
    case OPC_MXU_D32SLLV:
        /* TODO: Implement emulation of D32SLLV instruction. */
        MIPS_INVAL("OPC_MXU_D32SLLV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_D32SLRV:
        /* TODO: Implement emulation of D32SLRV instruction. */
        MIPS_INVAL("OPC_MXU_D32SLRV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_D32SARV:
        /* TODO: Implement emulation of D32SARV instruction. */
        MIPS_INVAL("OPC_MXU_D32SARV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16SLLV:
        /* TODO: Implement emulation of Q16SLLV instruction. */
        MIPS_INVAL("OPC_MXU_Q16SLLV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16SLRV:
        /* TODO: Implement emulation of Q16SLRV instruction. */
        MIPS_INVAL("OPC_MXU_Q16SLRV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16SARV:
        /* TODO: Implement emulation of Q16SARV instruction. */
        MIPS_INVAL("OPC_MXU_Q16SARV");
        generate_exception_end(ctx, EXCP_RI);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}